

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  uint uVar1;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata_00;
  size_t err_code;
  ZSTD_entropyCTablesMetadata_t *entropyMetadata;
  ZSTD_CCtx *zc_local;
  seqStore_t *seqStore_local;
  
  entropyMetadata_00 = &(zc->blockSplitCtx).entropyMetadata;
  seqStore_local =
       (seqStore_t *)
       ZSTD_buildBlockEntropyStats
                 (seqStore,&((zc->blockState).prevCBlock)->entropy,
                  &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,entropyMetadata_00,
                  zc->entropyWorkspace,0x22d8);
  uVar1 = ERR_isError((size_t)seqStore_local);
  if (uVar1 == 0) {
    seqStore_local =
         (seqStore_t *)
         ZSTD_estimateBlockSize
                   (seqStore->litStart,(long)seqStore->lit - (long)seqStore->litStart,
                    seqStore->ofCode,seqStore->llCode,seqStore->mlCode,
                    (long)seqStore->sequences - (long)seqStore->sequencesStart >> 3,
                    &((zc->blockState).nextCBlock)->entropy,entropyMetadata_00,zc->entropyWorkspace,
                    0x22d8,(uint)((entropyMetadata_00->hufMetadata).hType == set_compressed),1);
  }
  return (size_t)seqStore_local;
}

Assistant:

static size_t
ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, ZSTD_CCtx* zc)
{
    ZSTD_entropyCTablesMetadata_t* const entropyMetadata = &zc->blockSplitCtx.entropyMetadata;
    DEBUGLOG(6, "ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize()");
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE), "");
    return ZSTD_estimateBlockSize(
                    seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata->hufMetadata.hType == set_compressed), 1);
}